

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_nister::pollishCoefficients
               (Matrix<double,_10,_20,_0,_10,_20> *A,double *x_coeff,double *y_coeff,double *z_coeff
               )

{
  Scalar SVar1;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  *this;
  Scalar *pSVar2;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  *pLVar3;
  Scalar *in_RCX;
  Scalar *in_RDX;
  Scalar *in_RSI;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  lm;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  numDiff;
  PollishCoefficientsFunctor functor;
  VectorXd x;
  int n;
  Matrix<double,_10,_20,_0,_10,_20> *in_stack_fffffffffffffdb8;
  PollishCoefficientsFunctor *in_stack_fffffffffffffdc0;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  *in_stack_fffffffffffffdc8;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffdd0;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  *_functor;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  local_70;
  Functor local_58 [3];
  undefined4 local_24;
  Scalar *local_20;
  Scalar *local_18;
  Scalar *local_10;
  
  local_24 = 3;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdc8);
  _functor = (NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
              *)*local_10;
  this = (LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
          *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  (this->parameters).factor = (double)_functor;
  pLVar3 = (LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
            *)*local_18;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  *pSVar2 = (Scalar)pLVar3;
  SVar1 = *local_20;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  *pSVar2 = SVar1;
  PollishCoefficientsFunctor::PollishCoefficientsFunctor
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  Eigen::
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  ::NumericalDiff(&local_70,local_58,0.0);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  ::LevenbergMarquardt(this,_functor);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  ::resetParameters(pLVar3);
  Eigen::GenericNumTraits<double>::epsilon();
  Eigen::GenericNumTraits<double>::epsilon();
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  ::minimize(in_stack_fffffffffffffdc8,(FVectorType *)in_stack_fffffffffffffdc0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  *local_10 = *pSVar2;
  pLVar3 = (LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
            *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  *local_18 = (pLVar3->parameters).factor;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pLVar3,
                      (Index)in_stack_fffffffffffffdb8);
  *local_20 = *pSVar2;
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  ::~LevenbergMarquardt(pLVar3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xee610d);
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister::pollishCoefficients(
    const Eigen::Matrix<double,10,20> & A,
    double & x_coeff,
    double & y_coeff,
    double & z_coeff)
{
  const int n=3;
  VectorXd x(n);

  x[0] = x_coeff;
  x[1] = y_coeff;
  x[2] = z_coeff;

  PollishCoefficientsFunctor functor( A );
  NumericalDiff<PollishCoefficientsFunctor> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<PollishCoefficientsFunctor> >
      lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 5;
  lm.minimize(x);

  x_coeff = x[0];
  y_coeff = x[1];
  z_coeff = x[2];
}